

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O0

int merge_update(quicly_ranges_t *ranges,uint64_t start,uint64_t end,size_t slot,size_t end_slot)

{
  size_t in_RCX;
  ulong in_RDX;
  quicly_ranges_t *in_RSI;
  long *in_RDI;
  size_t in_R8;
  ulong local_30;
  
  if (in_RSI < *(quicly_ranges_t **)(*in_RDI + in_RCX * 0x10)) {
    *(quicly_ranges_t **)(*in_RDI + in_RCX * 0x10) = in_RSI;
  }
  local_30 = in_RDX;
  if (in_RDX < *(ulong *)(*in_RDI + in_R8 * 0x10 + 8)) {
    local_30 = *(ulong *)(*in_RDI + in_R8 * 0x10 + 8);
  }
  *(ulong *)(*in_RDI + in_RCX * 0x10 + 8) = local_30;
  if (in_RCX != in_R8) {
    quicly_ranges_drop_by_range_indices(in_RSI,in_RDX,in_RCX);
  }
  return 0;
}

Assistant:

static inline int merge_update(quicly_ranges_t *ranges, uint64_t start, uint64_t end, size_t slot, size_t end_slot)
{
    if (start < ranges->ranges[slot].start)
        ranges->ranges[slot].start = start;
    ranges->ranges[slot].end = end < ranges->ranges[end_slot].end ? ranges->ranges[end_slot].end : end;

    if (slot != end_slot)
        quicly_ranges_drop_by_range_indices(ranges, slot + 1, end_slot + 1);

    return 0;
}